

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O3

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<void_*>::verifyValidity
          (StateQueryMemoryWriteGuard<void_*> *this,ResultCollector *result)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  string local_30;
  
  if (*(char *)&this->m_preguard == -0x22) {
    uVar2 = 0xffffffffffffffff;
    do {
      if (uVar2 == 6) goto LAB_00499eba;
      uVar3 = uVar2 + 1;
      lVar1 = uVar2 + 2;
      uVar2 = uVar3;
    } while (*(char *)((long)&this->m_preguard + lVar1) == -0x22);
    if (6 < uVar3) {
LAB_00499eba:
      if (*(char *)&this->m_postguard == -0x22) {
        uVar2 = 0;
        do {
          uVar3 = uVar2;
          if (uVar3 == 7) goto LAB_00499f2e;
          uVar2 = uVar3 + 1;
        } while (*(char *)((long)&this->m_postguard + uVar3 + 1) == -0x22);
        if (6 < uVar3) {
LAB_00499f2e:
          if (*(char *)&this->m_value != -0x22) {
            return true;
          }
          uVar2 = 0;
          do {
            uVar3 = uVar2;
            if (uVar3 == 7) goto LAB_00499f55;
            uVar2 = uVar3 + 1;
          } while (*(char *)((long)&this->m_value + uVar3 + 1) == -0x22);
          if (uVar3 < 7) {
            return true;
          }
LAB_00499f55:
          local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_30,"Get* did not return a value","");
          tcu::ResultCollector::fail(result,&local_30);
          goto LAB_00499f0d;
        }
      }
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"post-guard value was modified","");
      tcu::ResultCollector::fail(result,&local_30);
      goto LAB_00499f0d;
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"pre-guard value was modified","");
  tcu::ResultCollector::fail(result,&local_30);
LAB_00499f0d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::ResultCollector& result) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		result.fail("pre-guard value was modified");
		return false;
	}
	else if (isPostguardContaminated())
	{
		result.fail("post-guard value was modified");
		return false;
	}
	else if (isUndefined())
	{
		result.fail("Get* did not return a value");
		return false;
	}

	return true;
}